

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

int Dau_InsertFunction(Abc_TtHieMan_t *pMan,word *pCur,int nNodes,int nInputs,int nVars0,int nVars,
                      Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,abctime clk)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  long lVar14;
  ulong uVar15;
  word *pwVar16;
  int iVar17;
  ulong uVar18;
  word *pwVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint nVars_00;
  word *pwVar23;
  word *tLimit;
  char Perm [16];
  char local_48 [24];
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  if (nInputs < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  if (nVars < 1) {
    nVars_00 = 0;
LAB_0051c2c4:
    if (nVars < (int)nVars_00) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda,pMan,pCur,nVars_00,local_48,99);
    iVar9 = vTtMem->nEntries;
    Vec_MemHashInsert(vTtMem,pCur);
    iVar17 = 0;
    if (iVar9 != vTtMem->nEntries) {
      Vec_IntPush(vNodSup,nVars_00 | nNodes << 0x10);
      iVar9 = vTtMem->nEntries;
      if (iVar9 != vNodSup->nSize) {
        __assert_fail("Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                      ,0x269,
                      "int Dau_InsertFunction(Abc_TtHieMan_t *, word *, int, int, int, int, Vec_Mem_t *, Vec_Int_t *, int, abctime)"
                     );
      }
      iVar17 = 1;
      if ((iVar9 * 0x68c26139 + 0x218c0U >> 6 | iVar9 * -0x1c000000) < 0x10c7) {
        Dau_TablesSave(nInputs,nVars0,vTtMem,vNodSup,nFronts,clk);
      }
    }
    return iVar17;
  }
  iVar9 = nInputs + -6;
  uVar4 = 1 << ((byte)iVar9 & 0x1f);
  pwVar1 = pCur + (int)uVar4;
  if ((int)uVar4 < 2) {
    uVar4 = 1;
  }
  uVar11 = 0;
  nVars_00 = 0;
LAB_0051befa:
  bVar6 = (byte)uVar11;
  bVar8 = (byte)nVars_00;
  if (nInputs < 7) {
    uVar15 = *pCur;
    bVar6 = (byte)(1 << (bVar6 & 0x1f));
    if ((s_Truths6Neg[uVar11] & (uVar15 >> (bVar6 & 0x3f) ^ uVar15)) == 0) goto LAB_0051c2b3;
    lVar14 = (long)(int)nVars_00;
    if (lVar14 < (long)uVar11) {
      bVar6 = (char)(-1 << (bVar8 & 0x1f)) + bVar6;
      *pCur = (uVar15 & *(ulong *)(lVar14 * 0x90 + 0x9e7050 + uVar11 * 0x18)) >> (bVar6 & 0x3f) |
              (*(ulong *)(lVar14 * 0x90 + 0x9e7048 + uVar11 * 0x18) & uVar15) << (bVar6 & 0x3f) |
              s_PPMasks[lVar14][uVar11][0] & uVar15;
    }
    goto LAB_0051c29c;
  }
  if (uVar11 < 6) {
    if (iVar9 != 0x1f) {
      uVar15 = 0;
      do {
        if (((pCur[uVar15] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ pCur[uVar15]) &
            s_Truths6Neg[uVar11]) != 0) goto LAB_0051c042;
        uVar15 = uVar15 + 1;
      } while (uVar4 != uVar15);
    }
  }
  else if (iVar9 != 0x1f) {
    bVar7 = (byte)(uVar11 - 6);
    uVar5 = 1 << (bVar7 & 0x1f);
    iVar17 = 2 << (bVar7 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar5) {
      uVar15 = (ulong)uVar5;
    }
    pwVar12 = pCur + (int)uVar5;
    pwVar16 = pCur;
    do {
      if (uVar11 - 6 != 0x1f) {
        uVar20 = 0;
        do {
          if (pwVar16[uVar20] != pwVar12[uVar20]) goto LAB_0051c042;
          uVar20 = uVar20 + 1;
        } while (uVar15 != uVar20);
      }
      pwVar16 = pwVar16 + iVar17;
      pwVar12 = pwVar12 + iVar17;
    } while (pwVar16 < pwVar1);
  }
  goto LAB_0051c2b3;
LAB_0051c042:
  lVar14 = (long)(int)nVars_00;
  if (lVar14 < (long)uVar11) {
    if (uVar11 < 6) {
      if (iVar9 != 0x1f) {
        bVar6 = (char)(1 << (bVar6 & 0x1f)) + (char)(-1 << (bVar8 & 0x1f));
        uVar15 = s_PPMasks[lVar14][uVar11][0];
        uVar20 = *(ulong *)(lVar14 * 0x90 + 0x9e7048 + uVar11 * 0x18);
        uVar21 = *(ulong *)(lVar14 * 0x90 + 0x9e7050 + uVar11 * 0x18);
        uVar18 = 0;
        do {
          uVar2 = pCur[uVar18];
          pCur[uVar18] = (uVar2 & uVar21) >> (bVar6 & 0x3f) |
                         (uVar2 & uVar20) << (bVar6 & 0x3f) | uVar2 & uVar15;
          uVar18 = uVar18 + 1;
        } while (uVar4 != uVar18);
      }
    }
    else if ((int)nVars_00 < 6) {
      if (iVar9 != 0x1f) {
        bVar6 = (byte)(uVar11 - 6);
        uVar5 = 1 << (bVar6 & 0x1f);
        iVar17 = 2 << (bVar6 & 0x1f);
        uVar15 = 1;
        if (1 < (int)uVar5) {
          uVar15 = (ulong)uVar5;
        }
        pwVar12 = pCur + (int)uVar5;
        pwVar16 = pCur;
        do {
          if (uVar11 - 6 != 0x1f) {
            uVar20 = s_Truths6[lVar14];
            uVar21 = 0;
            do {
              uVar18 = pwVar16[uVar21];
              bVar6 = (byte)(1 << (bVar8 & 0x1f));
              uVar2 = pwVar12[uVar21];
              pwVar16[uVar21] = uVar18 & ~uVar20 | uVar2 << (bVar6 & 0x3f) & uVar20;
              pwVar12[uVar21] = uVar2 & uVar20 | (uVar18 & uVar20) >> (bVar6 & 0x3f);
              uVar21 = uVar21 + 1;
            } while (uVar15 != uVar21);
          }
          pwVar16 = pwVar16 + iVar17;
          pwVar12 = pwVar12 + iVar17;
        } while (pwVar16 < pwVar1);
      }
    }
    else if (iVar9 != 0x1f) {
      bVar6 = (byte)(uVar11 - 6);
      bVar8 = (byte)(nVars_00 - 6);
      uVar5 = 1 << (bVar8 & 0x1f);
      iVar17 = 2 << (bVar6 & 0x1f);
      uVar15 = 1;
      if (1 < (int)uVar5) {
        uVar15 = (ulong)uVar5;
      }
      lVar14 = (long)(2 << (bVar8 & 0x1f));
      lVar22 = (long)(1 << (bVar6 & 0x1f));
      pwVar12 = pCur + lVar22;
      pwVar16 = pCur + (int)uVar5;
      pwVar23 = pCur;
      do {
        if (uVar11 - 6 != 0x1f) {
          lVar10 = 0;
          pwVar13 = pwVar16;
          pwVar19 = pwVar12;
          do {
            if (nVars_00 - 6 != 0x1f) {
              uVar20 = 0;
              do {
                wVar3 = pwVar13[uVar20];
                pwVar13[uVar20] = pwVar19[uVar20];
                pwVar19[uVar20] = wVar3;
                uVar20 = uVar20 + 1;
              } while (uVar15 != uVar20);
            }
            lVar10 = lVar10 + lVar14;
            pwVar19 = pwVar19 + lVar14;
            pwVar13 = pwVar13 + lVar14;
          } while (lVar10 < lVar22);
        }
        pwVar23 = pwVar23 + iVar17;
        pwVar12 = pwVar12 + iVar17;
        pwVar16 = pwVar16 + iVar17;
      } while (pwVar23 < pwVar1);
    }
  }
LAB_0051c29c:
  nVars_00 = nVars_00 + 1;
LAB_0051c2b3:
  uVar11 = uVar11 + 1;
  if (uVar11 == (uint)nVars) goto LAB_0051c2c4;
  goto LAB_0051befa;
}

Assistant:

int Dau_InsertFunction( Abc_TtHieMan_t * pMan, word * pCur, int nNodes, int nInputs, int nVars0, int nVars, 
    Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    int DumpDelta = 1000000;
    char Perm[16] = {0};
    int nVarsNew = Abc_TtMinBase( pCur, NULL, nVars, nInputs );
    //unsigned Phase = Abc_TtCanonicizeHie( pMan, pCur, nVarsNew, Perm, 1 );
    unsigned Phase = Abc_TtCanonicizeWrap( Abc_TtCanonicizeAda, pMan, pCur, nVarsNew, Perm, 99 );
    int nEntries = Vec_MemEntryNum(vTtMem);
    int Entry = Vec_MemHashInsert( vTtMem, pCur );
    if ( nEntries == Vec_MemEntryNum(vTtMem) ) // found in the table - not new
        return 0;
    Entry = 0;
    Phase = 0;
    // this is a new class
    Vec_IntPush( vNodSup, (nNodes << 16) | nVarsNew );
    assert( Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup) );
    if ( Vec_IntSize(vNodSup) % DumpDelta == 0 )
        Dau_TablesSave( nInputs, nVars0, vTtMem, vNodSup, nFronts, clk );
    return 1;
}